

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int __fd;
  ulong uVar1;
  undefined1 auStack_58 [4];
  int written;
  iovec buffers [3];
  int fd;
  char **argv_local;
  int argc_local;
  
  __fd = open(file_name,0x242,0x1b6);
  if (__fd == -1) {
    printf("open returned (-1)\n");
    argv_local._4_4_ = -1;
  }
  else {
    _auStack_58 = file_data1;
    buffers[0].iov_base = (void *)strlen(file_data1);
    buffers[0].iov_len = (size_t)file_data2;
    buffers[1].iov_base = (void *)strlen(file_data2);
    buffers[1].iov_len = (size_t)file_data3;
    buffers[2].iov_base = (void *)strlen(file_data3);
    uVar1 = writev(__fd,(iovec *)auStack_58,3);
    if ((int)uVar1 == -1) {
      printf("writev returned (-1)\n");
      argv_local._4_4_ = -1;
    }
    else {
      printf("wrote %d bytes\n",uVar1 & 0xffffffff);
      close(__fd);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{

    int fd = open(file_name, O_CREAT | O_TRUNC | O_RDWR, 0666);
    if(fd == (-1))
    {
        printf("open returned (-1)\n");
        return (-1);
    }

    struct iovec buffers[3];
    buffers[0].iov_base = file_data1;
    buffers[0].iov_len = strlen(file_data1);
    buffers[1].iov_base = file_data2;
    buffers[1].iov_len = strlen(file_data2);
    buffers[2].iov_base = file_data3;
    buffers[2].iov_len = strlen(file_data3);

    int written = writev(fd, buffers, 3);
    if(written == (-1))
    {
        printf("writev returned (-1)\n");
        return (-1);
    }
    printf("wrote %d bytes\n", written);

    close(fd);
    return 0;
}